

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::EnumOneofFieldGenerator::GenerateSerializationCode
          (EnumOneofFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&(this->super_PrimitiveOneofFieldGenerator).
                              super_PrimitiveFieldGenerator.super_FieldGeneratorBase.variables_,
                     "if ($has_property_check$) {\n  output.WriteRawTag($tag_bytes$);\n  output.WriteEnum((int) $property_name$);\n}\n"
                    );
  return;
}

Assistant:

void EnumOneofFieldGenerator::GenerateSerializationCode(io::Printer* printer) {
  printer->Print(
    variables_,
    "if ($has_property_check$) {\n"
    "  output.WriteRawTag($tag_bytes$);\n"
    "  output.WriteEnum((int) $property_name$);\n"
    "}\n");
}